

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

U32 ZSTD_insertAndFindFirstIndex_internal
              (ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,BYTE *ip,U32 mls)

{
  U32 hBits;
  U32 *pUVar1;
  U32 *pUVar2;
  BYTE *pBVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  
  pUVar1 = ms->hashTable;
  uVar4 = cParams->chainLog;
  hBits = cParams->hashLog;
  pUVar2 = ms->chainTable;
  pBVar3 = (ms->window).base;
  uVar6 = (long)ip - (long)pBVar3;
  for (uVar7 = (ulong)ms->nextToUpdate; uVar7 < (uVar6 & 0xffffffff); uVar7 = uVar7 + 1) {
    sVar5 = ZSTD_hashPtr(pBVar3 + uVar7,hBits,mls);
    pUVar2[(uint)uVar7 & ~(-1 << ((byte)uVar4 & 0x1f))] = pUVar1[sVar5];
    pUVar1[sVar5] = (uint)uVar7;
  }
  ms->nextToUpdate = (U32)uVar6;
  sVar5 = ZSTD_hashPtr(ip,hBits,mls);
  return pUVar1[sVar5];
}

Assistant:

static U32 ZSTD_insertAndFindFirstIndex_internal(
                        ZSTD_matchState_t* ms, ZSTD_compressionParameters const* cParams,
                        const BYTE* ip, U32 const mls)
{
    U32* const hashTable  = ms->hashTable;
    const U32 hashLog = cParams->hashLog;
    U32* const chainTable = ms->chainTable;
    const U32 chainMask = (1 << cParams->chainLog) - 1;
    const BYTE* const base = ms->window.base;
    const U32 target = (U32)(ip - base);
    U32 idx = ms->nextToUpdate;

    while(idx < target) { /* catch up */
        size_t const h = ZSTD_hashPtr(base+idx, hashLog, mls);
        NEXT_IN_CHAIN(idx, chainMask) = hashTable[h];
        hashTable[h] = idx;
        idx++;
    }

    ms->nextToUpdate = target;
    return hashTable[ZSTD_hashPtr(ip, hashLog, mls)];
}